

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O1

char * deblank(char *input)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  if (input == (char *)0x0) {
    return (char *)0x0;
  }
  sVar2 = strlen(input);
  if (sVar2 == 0) {
    pcVar3 = (char *)calloc(1,8);
    return pcVar3;
  }
  lVar8 = 0;
  do {
    lVar4 = lVar8;
    lVar8 = lVar4 + 1;
  } while (input[lVar4] == ' ');
  uVar6 = sVar2 & 0xffffffff;
  uVar1 = (int)sVar2 - 1;
  do {
    uVar6 = uVar6 - 1;
    uVar5 = (uint)uVar6;
    uVar7 = (int)uVar1 >> 0x1f & uVar1;
    if ((int)uVar5 < 1) break;
    uVar7 = uVar5;
  } while (input[uVar5 & 0x7fffffff] == ' ');
  lVar8 = (long)(int)uVar7 - (lVar4 + 1);
  pcVar3 = (char *)calloc(lVar8 + 3,1);
  pcVar3 = strncpy(pcVar3,input + lVar4,lVar8 + 2);
  return pcVar3;
}

Assistant:

char* 
deblank(const char* input) 
{
	int start = 0;
	int stop = 0;
	size_t length = 0;
	size_t full_length = 0;
	char* result = (char*)NULL;
	
	if (!input) return NULL;
	
	full_length = strlen(input);
	if (0 == full_length) {
		return (char*)calloc(1, sizeof(char*));
	}
	
	for (start = 0; *(input + start) == ' '; start++)
		;
	
	for (stop = full_length - 1; stop > 0; stop--) {
		if (*(input + stop) != ' ') break;
	} 
	
	length = full_length - start + 1; 
	length -= full_length - stop;
	
	result = (char*)calloc(length + 1, sizeof(char));
	strncpy(result, input + start, length);
	
	/* Normal function termination */
	return result;
}